

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O3

CImgDisplay * __thiscall
cimg_library::CImgDisplay::set_key(CImgDisplay *this,uint keycode,bool is_pressed)

{
  int iVar1;
  uint *puVar2;
  
  if ((int)keycode < 0xff1b) {
    if ((int)keycode < 0xff08) {
      switch(keycode) {
      case 0x20:
        this->_is_keySPACE = is_pressed;
        break;
      case 0x30:
        this->_is_key0 = is_pressed;
        break;
      case 0x31:
        this->_is_key1 = is_pressed;
        break;
      case 0x32:
        this->_is_key2 = is_pressed;
        break;
      case 0x33:
        this->_is_key3 = is_pressed;
        break;
      case 0x34:
        this->_is_key4 = is_pressed;
        break;
      case 0x35:
        this->_is_key5 = is_pressed;
        break;
      case 0x36:
        this->_is_key6 = is_pressed;
        break;
      case 0x37:
        this->_is_key7 = is_pressed;
        break;
      case 0x38:
        this->_is_key8 = is_pressed;
        break;
      case 0x39:
        this->_is_key9 = is_pressed;
        break;
      case 0x61:
        this->_is_keyA = is_pressed;
        break;
      case 0x62:
        this->_is_keyB = is_pressed;
        break;
      case 99:
        this->_is_keyC = is_pressed;
        break;
      case 100:
        this->_is_keyD = is_pressed;
        break;
      case 0x65:
        this->_is_keyE = is_pressed;
        break;
      case 0x66:
        this->_is_keyF = is_pressed;
        break;
      case 0x67:
        this->_is_keyG = is_pressed;
        break;
      case 0x68:
        this->_is_keyH = is_pressed;
        break;
      case 0x69:
        this->_is_keyI = is_pressed;
        break;
      case 0x6a:
        this->_is_keyJ = is_pressed;
        break;
      case 0x6b:
        this->_is_keyK = is_pressed;
        break;
      case 0x6c:
        this->_is_keyL = is_pressed;
        break;
      case 0x6d:
        this->_is_keyM = is_pressed;
        break;
      case 0x6e:
        this->_is_keyN = is_pressed;
        break;
      case 0x6f:
        this->_is_keyO = is_pressed;
        break;
      case 0x70:
        this->_is_keyP = is_pressed;
        break;
      case 0x71:
        this->_is_keyQ = is_pressed;
        break;
      case 0x72:
        this->_is_keyR = is_pressed;
        break;
      case 0x73:
        this->_is_keyS = is_pressed;
        break;
      case 0x74:
        this->_is_keyT = is_pressed;
        break;
      case 0x75:
        this->_is_keyU = is_pressed;
        break;
      case 0x76:
        this->_is_keyV = is_pressed;
        break;
      case 0x77:
        this->_is_keyW = is_pressed;
        break;
      case 0x78:
        this->_is_keyX = is_pressed;
        break;
      case 0x79:
        this->_is_keyY = is_pressed;
        break;
      case 0x7a:
        this->_is_keyZ = is_pressed;
      }
    }
    else if ((int)keycode < 0xff0d) {
      if (keycode == 0xff08) {
        this->_is_keyBACKSPACE = is_pressed;
      }
      else if (keycode == 0xff09) {
        this->_is_keyTAB = is_pressed;
      }
    }
    else if (keycode == 0xff0d) {
      this->_is_keyENTER = is_pressed;
    }
    else if (keycode == 0xff13) {
      this->_is_keyPAUSE = is_pressed;
    }
  }
  else {
    switch(keycode) {
    case 0xffaa:
      this->_is_keyPADMUL = is_pressed;
      break;
    case 0xffab:
      this->_is_keyPADADD = is_pressed;
      break;
    case 0xffac:
    case 0xffae:
    case 0xffba:
    case 0xffbb:
    case 0xffbc:
    case 0xffbd:
    case 0xffca:
    case 0xffcb:
    case 0xffcc:
    case 0xffcd:
    case 0xffce:
    case 0xffcf:
    case 0xffd0:
    case 0xffd1:
    case 0xffd2:
    case 0xffd3:
    case 0xffd4:
    case 0xffd5:
    case 0xffd6:
    case 0xffd7:
    case 0xffd8:
    case 0xffd9:
    case 0xffda:
    case 0xffdb:
    case 0xffdc:
    case 0xffdd:
    case 0xffde:
    case 0xffdf:
    case 0xffe0:
    case 0xffe6:
    case 0xffe7:
    case 0xffe8:
    case 0xffed:
    case 0xffee:
    case 0xffef:
    case 0xfff0:
    case 0xfff1:
    case 0xfff2:
    case 0xfff3:
    case 0xfff4:
    case 0xfff5:
    case 0xfff6:
    case 0xfff7:
    case 0xfff8:
    case 0xfff9:
    case 0xfffa:
    case 0xfffb:
    case 0xfffc:
    case 0xfffd:
    case 0xfffe:
      break;
    case 0xffad:
      this->_is_keyPADSUB = is_pressed;
      break;
    case 0xffaf:
      this->_is_keyPADDIV = is_pressed;
      break;
    case 0xffb0:
      this->_is_keyPAD0 = is_pressed;
      break;
    case 0xffb1:
      this->_is_keyPAD1 = is_pressed;
      break;
    case 0xffb2:
      this->_is_keyPAD2 = is_pressed;
      break;
    case 0xffb3:
      this->_is_keyPAD3 = is_pressed;
      break;
    case 0xffb4:
      this->_is_keyPAD4 = is_pressed;
      break;
    case 0xffb5:
      this->_is_keyPAD5 = is_pressed;
      break;
    case 0xffb6:
      this->_is_keyPAD6 = is_pressed;
      break;
    case 0xffb7:
      this->_is_keyPAD7 = is_pressed;
      break;
    case 0xffb8:
      this->_is_keyPAD8 = is_pressed;
      break;
    case 0xffb9:
      this->_is_keyPAD9 = is_pressed;
      break;
    case 0xffbe:
      this->_is_keyF1 = is_pressed;
      break;
    case 0xffbf:
      this->_is_keyF2 = is_pressed;
      break;
    case 0xffc0:
      this->_is_keyF3 = is_pressed;
      break;
    case 0xffc1:
      this->_is_keyF4 = is_pressed;
      break;
    case 0xffc2:
      this->_is_keyF5 = is_pressed;
      break;
    case 0xffc3:
      this->_is_keyF6 = is_pressed;
      break;
    case 0xffc4:
      this->_is_keyF7 = is_pressed;
      break;
    case 0xffc5:
      this->_is_keyF8 = is_pressed;
      break;
    case 0xffc6:
      this->_is_keyF9 = is_pressed;
      break;
    case 0xffc7:
      this->_is_keyF10 = is_pressed;
      break;
    case 0xffc8:
      this->_is_keyF11 = is_pressed;
      break;
    case 0xffc9:
      this->_is_keyF12 = is_pressed;
      break;
    case 0xffe1:
      this->_is_keySHIFTLEFT = is_pressed;
      break;
    case 0xffe2:
      this->_is_keySHIFTRIGHT = is_pressed;
      break;
    case 0xffe3:
      this->_is_keyCTRLLEFT = is_pressed;
      break;
    case 0xffe4:
      this->_is_keyCTRLRIGHT = is_pressed;
      break;
    case 0xffe5:
      this->_is_keyCAPSLOCK = is_pressed;
      break;
    case 0xffe9:
      this->_is_keyALT = is_pressed;
      break;
    case 0xffea:
      this->_is_keyALTGR = is_pressed;
      break;
    case 0xffeb:
      this->_is_keyAPPLEFT = is_pressed;
      break;
    case 0xffec:
      this->_is_keyAPPRIGHT = is_pressed;
      break;
    case 0xffff:
      this->_is_keyDELETE = is_pressed;
      break;
    default:
      switch(keycode) {
      case 0xff50:
        this->_is_keyHOME = is_pressed;
        break;
      case 0xff51:
        this->_is_keyARROWLEFT = is_pressed;
        break;
      case 0xff52:
        this->_is_keyARROWUP = is_pressed;
        break;
      case 0xff53:
        this->_is_keyARROWRIGHT = is_pressed;
        break;
      case 0xff54:
        this->_is_keyARROWDOWN = is_pressed;
        break;
      case 0xff55:
        this->_is_keyPAGEUP = is_pressed;
        break;
      case 0xff56:
        this->_is_keyPAGEDOWN = is_pressed;
        break;
      case 0xff57:
        this->_is_keyEND = is_pressed;
        break;
      case 0xff58:
      case 0xff59:
      case 0xff5a:
      case 0xff5b:
      case 0xff5c:
      case 0xff5d:
      case 0xff5e:
      case 0xff5f:
      case 0xff60:
      case 0xff61:
      case 0xff62:
      case 0xff64:
      case 0xff65:
      case 0xff66:
        break;
      case 0xff63:
        this->_is_keyINSERT = is_pressed;
        break;
      case 0xff67:
        this->_is_keyMENU = is_pressed;
        break;
      default:
        if (keycode == 0xff1b) {
          this->_is_keyESC = is_pressed;
        }
      }
    }
  }
  puVar2 = this->_keys;
  if (is_pressed) {
    if (*puVar2 != 0) {
      memmove(puVar2 + 1,puVar2,0x1fc);
      puVar2 = this->_keys;
    }
    *puVar2 = keycode;
    puVar2 = this->_released_keys;
    if (*puVar2 != 0) {
      memmove(puVar2 + 1,puVar2,0x1fc);
      *this->_released_keys = 0;
    }
  }
  else {
    if (*puVar2 != 0) {
      memmove(puVar2 + 1,puVar2,0x1fc);
      *this->_keys = 0;
    }
    puVar2 = this->_released_keys;
    if (*puVar2 != 0) {
      memmove(puVar2 + 1,puVar2,0x1fc);
      puVar2 = this->_released_keys;
    }
    *puVar2 = keycode;
  }
  this->_is_event = keycode != 0;
  if (keycode != 0) {
    if ((cimg::X11_attr()::val == '\0') &&
       (iVar1 = __cxa_guard_acquire(&cimg::X11_attr()::val), iVar1 != 0)) {
      cimg::X11_static::X11_static(&cimg::X11_attr::val);
      __cxa_atexit(cimg::X11_static::~X11_static,&cimg::X11_attr::val,&__dso_handle);
      __cxa_guard_release(&cimg::X11_attr()::val);
    }
    pthread_cond_broadcast((pthread_cond_t *)&cimg::X11_attr::val.wait_event);
  }
  return this;
}

Assistant:

CImgDisplay& set_key(const unsigned int keycode, const bool is_pressed=true) {
#define _cimg_set_key(k) if (keycode==cimg::key##k) _is_key##k = is_pressed;
      _cimg_set_key(ESC); _cimg_set_key(F1); _cimg_set_key(F2); _cimg_set_key(F3);
      _cimg_set_key(F4); _cimg_set_key(F5); _cimg_set_key(F6); _cimg_set_key(F7);
      _cimg_set_key(F8); _cimg_set_key(F9); _cimg_set_key(F10); _cimg_set_key(F11);
      _cimg_set_key(F12); _cimg_set_key(PAUSE); _cimg_set_key(1); _cimg_set_key(2);
      _cimg_set_key(3); _cimg_set_key(4); _cimg_set_key(5); _cimg_set_key(6);
      _cimg_set_key(7); _cimg_set_key(8); _cimg_set_key(9); _cimg_set_key(0);
      _cimg_set_key(BACKSPACE); _cimg_set_key(INSERT); _cimg_set_key(HOME);
      _cimg_set_key(PAGEUP); _cimg_set_key(TAB); _cimg_set_key(Q); _cimg_set_key(W);
      _cimg_set_key(E); _cimg_set_key(R); _cimg_set_key(T); _cimg_set_key(Y);
      _cimg_set_key(U); _cimg_set_key(I); _cimg_set_key(O); _cimg_set_key(P);
      _cimg_set_key(DELETE); _cimg_set_key(END); _cimg_set_key(PAGEDOWN);
      _cimg_set_key(CAPSLOCK); _cimg_set_key(A); _cimg_set_key(S); _cimg_set_key(D);
      _cimg_set_key(F); _cimg_set_key(G); _cimg_set_key(H); _cimg_set_key(J);
      _cimg_set_key(K); _cimg_set_key(L); _cimg_set_key(ENTER);
      _cimg_set_key(SHIFTLEFT); _cimg_set_key(Z); _cimg_set_key(X); _cimg_set_key(C);
      _cimg_set_key(V); _cimg_set_key(B); _cimg_set_key(N); _cimg_set_key(M);
      _cimg_set_key(SHIFTRIGHT); _cimg_set_key(ARROWUP); _cimg_set_key(CTRLLEFT);
      _cimg_set_key(APPLEFT); _cimg_set_key(ALT); _cimg_set_key(SPACE); _cimg_set_key(ALTGR);
      _cimg_set_key(APPRIGHT); _cimg_set_key(MENU); _cimg_set_key(CTRLRIGHT);
      _cimg_set_key(ARROWLEFT); _cimg_set_key(ARROWDOWN); _cimg_set_key(ARROWRIGHT);
      _cimg_set_key(PAD0); _cimg_set_key(PAD1); _cimg_set_key(PAD2);
      _cimg_set_key(PAD3); _cimg_set_key(PAD4); _cimg_set_key(PAD5);
      _cimg_set_key(PAD6); _cimg_set_key(PAD7); _cimg_set_key(PAD8);
      _cimg_set_key(PAD9); _cimg_set_key(PADADD); _cimg_set_key(PADSUB);
      _cimg_set_key(PADMUL); _cimg_set_key(PADDIV);
      if (is_pressed) {
        if (*_keys)
          std::memmove((void*)(_keys + 1),(void*)_keys,127*sizeof(unsigned int));
        *_keys = keycode;
        if (*_released_keys) {
          std::memmove((void*)(_released_keys + 1),(void*)_released_keys,127*sizeof(unsigned int));
          *_released_keys = 0;
        }
      } else {
        if (*_keys) {
          std::memmove((void*)(_keys + 1),(void*)_keys,127*sizeof(unsigned int));
          *_keys = 0;
        }
        if (*_released_keys)
          std::memmove((void*)(_released_keys + 1),(void*)_released_keys,127*sizeof(unsigned int));
        *_released_keys = keycode;
      }
      _is_event = keycode?true:false;
      if (keycode) {
#if cimg_display==1
        pthread_cond_broadcast(&cimg::X11_attr().wait_event);
#elif cimg_display==2
        SetEvent(cimg::Win32_attr().wait_event);
#endif
      }
      return *this;
    }